

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkers.cpp
# Opt level: O3

bool make_kinged_proc(Am_Object *self)

{
  bool bVar1;
  Am_Value *pAVar2;
  ushort uVar3;
  Am_Object piece;
  Am_Object AStack_18;
  Am_Object local_10;
  
  Am_Object::Get_Object((ushort)&local_10,(ulong)self);
  pAVar2 = (Am_Value *)Am_Object::Get((ushort)&local_10,0x85);
  Am_Value::operator_cast_to_int(pAVar2);
  pAVar2 = (Am_Value *)Am_Object::Get((ushort)&local_10,(ulong)BLACK_PLAYER);
  bVar1 = Am_Value::operator_cast_to_bool(pAVar2);
  uVar3 = (ushort)&AStack_18;
  if (bVar1) {
    Am_Object::Get_Object(uVar3,0x10c320);
    pAVar2 = (Am_Value *)Am_Object::Get(uVar3,(ulong)KINGED);
    bVar1 = Am_Value::operator_cast_to_bool(pAVar2);
  }
  else {
    Am_Object::Get_Object(uVar3,0x10c318);
    pAVar2 = (Am_Value *)Am_Object::Get(uVar3,(ulong)KINGED);
    bVar1 = Am_Value::operator_cast_to_bool(pAVar2);
  }
  Am_Object::~Am_Object(&AStack_18);
  Am_Object::~Am_Object(&local_10);
  return bVar1;
}

Assistant:

Am_Define_Formula(bool, make_kinged)
{
  Am_Object piece = self.Get_Owner();
  int rank = piece.Get(Am_RANK);
  bool black_player = piece.Get(BLACK_PLAYER);
  if (black_player)
    return (bool)Black_Pieces.Get_Object(piece_slot[rank]).Get(KINGED);
  else
    return (bool)Red_Pieces.Get_Object(piece_slot[rank]).Get(KINGED);
}